

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O2

void do_interpdump(CHAR_DATA *ch,char *argument)

{
  FILE *pFVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  short *psVar6;
  long lVar7;
  long local_50;
  long local_48;
  
  pFVar1 = fopen("../logs/interpdump.txt","w");
  for (psVar6 = &cmd_table[0].hide; *(DO_FUN **)(psVar6 + -8) != (DO_FUN *)0x0;
      psVar6 = psVar6 + 0x14) {
    fprintf(pFVar1,";%s;0;do_%s;%d;%d;%d;\n",((cmd_type *)(psVar6 + -0xc))->name,
            ((cmd_type *)(psVar6 + -0xc))->name,(ulong)(uint)(int)psVar6[-3],
            (ulong)(uint)(int)psVar6[-2],(uint)(*psVar6 == 1) + (uint)(psVar6[-1] == 0) * 2);
  }
  fclose(pFVar1);
  pFVar1 = fopen("../logs/climate-dump.txt","w");
  lVar7 = 0x4ea8ca;
  local_50 = 0x4ea912;
  lVar2 = 0;
LAB_002d07f7:
  if (climate_table[lVar2].number == 8) {
    fclose(pFVar1);
    return;
  }
  fprintf(pFVar1,"%s;%d;",climate_table[lVar2].name);
  lVar4 = 0;
  local_48 = lVar7;
LAB_002d0832:
  lVar3 = lVar4;
  if (lVar4 != 0) {
    if (lVar4 == 9) goto LAB_002d0891;
    fputc(0x2c,pFVar1);
    lVar3 = 0;
  }
  psVar6 = (short *)(lVar3 * 0x12 + local_48);
  do {
    if (lVar3 != 0) {
      if (lVar3 == 4) goto LAB_002d0886;
      fputc(0x7c,pFVar1);
    }
    fprintf(pFVar1,"%d",(ulong)(uint)(int)*psVar6);
    lVar3 = lVar3 + 1;
    psVar6 = psVar6 + 9;
  } while( true );
LAB_002d0891:
  fputc(0x3b,pFVar1);
  lVar3 = 0;
  lVar4 = local_50;
LAB_002d08a4:
  lVar5 = lVar3;
  if (lVar3 != 0) {
    if (lVar3 == 4) goto LAB_002d08f5;
    fputc(0x2c,pFVar1);
    lVar5 = 0;
  }
  do {
    if (lVar5 != 0) {
      if (lVar5 == 4) goto code_r0x002d08ec;
      fputc(0x7c,pFVar1);
    }
    fprintf(pFVar1,"%d",(ulong)(uint)(int)*(short *)(lVar4 + lVar5 * 8));
    lVar5 = lVar5 + 1;
  } while( true );
LAB_002d08f5:
  fwrite(";\n",2,1,pFVar1);
  lVar2 = lVar2 + 1;
  lVar7 = lVar7 + 0x78;
  local_50 = local_50 + 0x78;
  goto LAB_002d07f7;
code_r0x002d08ec:
  lVar3 = lVar3 + 1;
  lVar4 = lVar4 + 2;
  goto LAB_002d08a4;
LAB_002d0886:
  lVar4 = lVar4 + 1;
  local_48 = local_48 + 2;
  goto LAB_002d0832;
}

Assistant:

void do_interpdump(CHAR_DATA *ch, char *argument)
{
	FILE *fp = fopen(INTERP_DUMP_FILE, "w");
	int i = 0, j = 0, k = 0;
	int bit = 0;

	for (i = 0; cmd_table[i].do_fun != nullptr; i++)
	{
		bit = 0;

		if (cmd_table[i].show == 0)
			bit += 2;

		if (cmd_table[i].hide == 1)
			bit += 1;

		fprintf(fp, ";%s;0;do_%s;%d;%d;%d;\n", cmd_table[i].name, cmd_table[i].name, cmd_table[i].level, cmd_table[i].log, bit);
	}
	fclose(fp);

	fp = fopen(CLIMATE_DUMP_FILE, "w");

	for (i = 0; climate_table[i].number != Climate::English; i++)
	{
		fprintf(fp, "%s;%d;", climate_table[i].name, climate_table[i].number);

		for (j = 0; j < WeatherCondition::MaxWeatherCondition; j++)
		{
			if (j != 0)
				fprintf(fp, ",");

			for (k = 0; k < Seasons::SeasonsCount; k++)
			{
				if (k != 0)
					fprintf(fp, "|");

				fprintf(fp, "%d", climate_table[i].skyfreqs[k][j]);
			}
		}

		fprintf(fp, ";");

		for (j = 0; j < Temperature::MaxTemperature; j++)
		{
			if (j != 0)
				fprintf(fp, ",");

			for (k = 0; k < Seasons::SeasonsCount; k++)
			{
				if (k != 0)
					fprintf(fp, "|");

				fprintf(fp, "%d", climate_table[i].tempfreqs[k][j]);
			}
		}

		fprintf(fp, ";\n");
	}

	fclose(fp);
}